

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O2

int fits_parser_workfn(long totalrows,long offset,long firstrow,long nrows,int nCols,
                      iteratorCol *colData,void *userPtr)

{
  anon_union_256_9_9da4f342_for_data *__src;
  Node *pNVar1;
  byte *pbVar2;
  double dVar3;
  char cVar4;
  int iVar5;
  ParseData *lParse;
  DataInfo *pDVar6;
  Node *pNVar7;
  undefined8 *__dest;
  int iVar8;
  int *piVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  long *plVar13;
  void *pvVar14;
  ulong uVar15;
  undefined8 *puVar16;
  iteratorCol *piVar17;
  byte bVar18;
  undefined4 uVar19;
  lval *plVar20;
  iteratorCol *piVar21;
  ulong uVar22;
  iteratorCol *piVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  undefined8 uVar27;
  ulong uVar28;
  size_t __size;
  long lVar29;
  uint uVar30;
  iteratorCol *piVar31;
  double *pdVar32;
  iteratorCol *piVar33;
  bool bVar34;
  ulong local_138;
  iteratorCol *local_130;
  iteratorCol *local_128;
  int *local_120;
  iteratorCol *local_118;
  iteratorCol *local_110;
  ulong local_108;
  int local_fc;
  ulong local_f8;
  iteratorCol *local_f0;
  iteratorCol *local_e8;
  iteratorCol *local_e0;
  char *local_d8;
  int status;
  long local_c8;
  long local_c0;
  size_t local_b8;
  ulong local_b0;
  long zeros [4];
  char undef;
  
  uVar28 = (ulong)(uint)nCols;
  local_fc = 0;
  lParse = *(ParseData **)((long)userPtr + 0x28);
  zeros[2] = 0;
  zeros[3] = 0;
  zeros[0] = 0;
  zeros[1] = 0;
  local_118 = colData;
  local_c8 = totalrows;
  if (DEBUG_PIXFILTER != 0) {
    printf("fits_parser_workfn(total=%ld, offset=%ld, first=%ld, rows=%ld, cols=%d)\n",totalrows,
           offset,firstrow,nrows,uVar28);
  }
  local_e8 = local_118 + nCols;
  local_f8 = uVar28;
  if (offset + 1 == firstrow) {
    *(void **)((long)userPtr + 0x68) = userPtr;
    *(undefined4 *)((long)userPtr + 0x20) = 0;
    for (local_138 = 0; (long)local_138 < (long)nCols; local_138 = local_138 + 1) {
      lParse->colData[local_138].repeat = local_118[local_138].repeat;
    }
    lVar10 = *(long *)((long)userPtr + 0x18);
    if (lVar10 < 1) {
      lVar26 = local_c8;
      if (lVar10 == 0) {
        lVar26 = nrows;
      }
    }
    else {
      lVar26 = lVar10;
      if (local_c8 <= lVar10) {
        lVar26 = local_c8;
      }
    }
    *(long *)((long)userPtr + 0x18) = lVar26;
    *(long *)((long)userPtr + 0x48) = lVar26 + firstrow + -1;
    piVar9 = (int *)userPtr;
    if (*(long *)((long)userPtr + 8) == 0) {
      iVar8 = local_e8[-1].iotype;
      if (iVar8 == 0) {
        ffpmsg("Output column for parser results not found!");
        return 0x1b2;
      }
      *(void **)((long)userPtr + 0x38) = local_e8[-1].array;
      *(int *)userPtr = local_e8[-1].datatype;
      status = 0;
      *(undefined8 *)((long)userPtr + 0x60) = 0;
      if (lParse->hdutype == 0) {
        lVar10 = lParse->pixFilter->blank;
        if (lVar10 != 0) goto LAB_00123f60;
      }
      else {
        if ((iVar8 == 3) ||
           (ffgknjj(local_e8[-1].fptr,"TNULL",local_e8[-1].colnum,1,
                    (LONGLONG *)((long)userPtr + 0x60),(int *)&local_138,&status), status != 0x193))
        {
          piVar9 = *(int **)((long)userPtr + 0x68);
          if (local_e8[-1].iotype != 3) goto LAB_00123f65;
        }
        else {
          piVar9 = *(int **)((long)userPtr + 0x68);
        }
        iVar8 = *piVar9;
        if (iVar8 == 0x15) {
          lVar10 = -0x8000;
        }
        else if (iVar8 == 0x29) {
          lVar10 = -0x8000000000000000;
        }
        else {
          if (iVar8 != 0x1f) goto LAB_00123f65;
          lVar10 = -0x80000000;
        }
LAB_00123f60:
        *(long *)((long)userPtr + 0x60) = lVar10;
      }
LAB_00123f65:
      plVar20 = (lval *)&local_e8[-1].repeat;
    }
    else {
      *(long *)((long)userPtr + 0x30) = *(long *)((long)userPtr + 8);
      plVar13 = zeros;
      if (*(long **)((long)userPtr + 0x10) != (long *)0x0) {
        plVar13 = *(long **)((long)userPtr + 0x10);
      }
      *(long **)((long)userPtr + 0x38) = plVar13;
      plVar20 = &lParse->Nodes[lParse->resultNode].value;
    }
    *(long *)((long)userPtr + 0x50) = plVar20->nelem;
    iVar8 = *piVar9;
    uVar19 = 1;
    if (((iVar8 == 1) || (iVar8 == 0xb)) || (iVar8 == 0xe)) {
LAB_00123fbd:
      *(undefined4 *)((long)userPtr + 0x40) = uVar19;
    }
    else {
      if ((iVar8 == 0x10) || (iVar8 == 0x52)) {
LAB_00123fbb:
        uVar19 = 8;
        goto LAB_00123fbd;
      }
      uVar19 = 4;
      if (iVar8 == 0x1f) goto LAB_00123fbd;
      if (iVar8 == 0x29) goto LAB_00123fbb;
      if (iVar8 == 0x2a) goto LAB_00123fbd;
      if (iVar8 == 0x51) goto LAB_00123fbb;
      if (iVar8 == 0x15) {
        uVar19 = 2;
        goto LAB_00123fbd;
      }
    }
    iVar8 = lParse->Nodes[lParse->resultNode].type;
    if ((iVar8 == 0x104) || (iVar8 == 0x103)) {
      *(undefined8 *)((long)userPtr + 0x58) = 8;
    }
    else if (iVar8 == 0x102) {
      *(undefined8 *)((long)userPtr + 0x58) = 1;
    }
  }
  else {
    piVar9 = *(int **)((long)userPtr + 0x68);
  }
  if (*(long *)(piVar9 + 2) == 0) {
    *(long *)((long)userPtr + 0x30) =
         (long)*(int *)((long)userPtr + 0x40) + (long)local_e8[-1].array;
    if ((local_e8[-1].iotype == 3) && (*(long *)(piVar9 + 4) != 0)) {
      *(long *)((long)userPtr + 0x38) = *(long *)(piVar9 + 4);
    }
    else {
      iVar8 = *piVar9;
      if (iVar8 == 0xb) {
        **(undefined1 **)((long)userPtr + 0x38) = *(undefined1 *)((long)userPtr + 0x60);
      }
      else {
        if (iVar8 == 0x52) {
          puVar16 = *(undefined8 **)((long)userPtr + 0x38);
          uVar27 = 0xb8a83e285ebab4b7;
        }
        else {
          if (iVar8 == 0x10) {
            *(undefined1 *)**(undefined8 **)((long)userPtr + 0x38) = 1;
            *(undefined1 *)(**(long **)((long)userPtr + 0x38) + 1) = 0;
            goto LAB_0012400c;
          }
          if (iVar8 == 0x15) {
            **(undefined2 **)((long)userPtr + 0x38) = *(undefined2 *)((long)userPtr + 0x60);
            goto LAB_0012400c;
          }
          if (iVar8 == 0x1f) {
            **(undefined4 **)((long)userPtr + 0x38) = *(undefined4 *)((long)userPtr + 0x60);
            goto LAB_0012400c;
          }
          if (iVar8 != 0x29) {
            if (iVar8 == 0x2a) {
              **(undefined4 **)((long)userPtr + 0x38) = 0x8541f136;
              goto LAB_0012400c;
            }
            if (iVar8 != 0x51) {
              if (iVar8 == 0xe) {
                **(undefined1 **)((long)userPtr + 0x38) = 0x55;
              }
              goto LAB_0012400c;
            }
          }
          puVar16 = *(undefined8 **)((long)userPtr + 0x38);
          uVar27 = *(undefined8 *)((long)userPtr + 0x60);
        }
        *puVar16 = uVar27;
      }
    }
  }
LAB_0012400c:
  lVar10 = *(long *)((long)userPtr + 0x48) - firstrow;
  piVar17 = (iteratorCol *)(lVar10 + 1);
  if (nrows <= lVar10) {
    piVar17 = (iteratorCol *)nrows;
  }
  local_c0 = *(long *)((long)userPtr + 0x30);
  lParse->firstDataRow = firstrow;
  lParse->nDataRows = (long)piVar17;
  local_e0 = (iteratorCol *)lParse->nPrevDataRows;
  local_120 = &lParse->status;
  local_b8 = (long)piVar17 * 8;
  piVar23 = (iteratorCol *)0x0;
  if (0 < (long)piVar17) {
    piVar23 = piVar17;
  }
  uVar28 = local_f8 & 0xffffffff;
  if ((int)local_f8 < 1) {
    uVar28 = 0;
  }
  uVar15 = 0;
  uVar22 = 0;
  piVar31 = local_118;
  local_110 = piVar17;
  local_f8 = uVar28;
  local_f0 = piVar23;
  local_d8 = (char *)firstrow;
LAB_00124097:
  piVar33 = piVar17;
  if (uVar22 == uVar28) goto LAB_0012469b;
  piVar33 = piVar31;
  local_108 = uVar15;
  if ((piVar31[uVar22].iotype & 0xfffffffeU) == 2) goto LAB_001244c6;
  piVar21 = (iteratorCol *)(lParse->varData + uVar22);
  local_b0 = uVar22;
  if (4 < piVar21->datatype - 0x102U) {
    snprintf(&undef,0x50,"SetupDataArrays, unhandled type %d\n");
    ffpmsg(&undef);
    piVar33 = local_118;
    piVar23 = local_f0;
    goto LAB_001244b0;
  }
  lVar10 = *(long *)&piVar21->iotype;
  __size = lVar10 * (long)piVar17;
  local_128 = piVar21;
  switch(piVar21->datatype) {
  case 0x102:
    pcVar12 = (char *)piVar31[uVar22].array;
    if (local_e0 != piVar17) {
      free(*(char **)(piVar21->tunit + 0x10));
      pcVar11 = (char *)malloc(__size);
      *(char **)(local_128->tunit + 0x10) = pcVar11;
      piVar23 = local_f0;
      piVar33 = local_118;
      if (pcVar11 == (char *)0x0) goto LAB_001245f8;
    }
    while (__size != 0) {
      if (*pcVar12 == '\0') {
        bVar34 = false;
      }
      else {
        bVar34 = *pcVar12 == pcVar12[__size];
      }
      (*(char **)(local_128->tunit + 0x10))[__size - 1] = bVar34;
      __size = __size - 1;
    }
    pdVar32 = (double *)(pcVar12 + 1);
    goto LAB_00124394;
  case 0x103:
    pdVar32 = (double *)piVar31[uVar22].array;
    if (local_e0 != piVar17) {
      free(*(char **)(piVar21->tunit + 0x10));
      pcVar12 = (char *)malloc(__size);
      *(char **)(local_128->tunit + 0x10) = pcVar12;
      piVar23 = local_f0;
      piVar33 = local_118;
      if (pcVar12 == (char *)0x0) goto LAB_001245f8;
    }
    while (__size != 0) {
      if (*pdVar32 == 0.0) {
        bVar34 = false;
      }
      else {
        bVar34 = *pdVar32 == pdVar32[__size];
      }
      (*(char **)(local_128->tunit + 0x10))[__size - 1] = bVar34;
      __size = __size - 1;
    }
    goto LAB_0012433f;
  case 0x104:
    pdVar32 = (double *)piVar31[uVar22].array;
    if (local_e0 != piVar17) {
      free(*(char **)(piVar21->tunit + 0x10));
      pcVar12 = (char *)malloc(__size);
      *(char **)(local_128->tunit + 0x10) = pcVar12;
      piVar23 = local_f0;
      piVar33 = local_118;
      if (pcVar12 == (char *)0x0) goto LAB_001245f8;
    }
    while (__size != 0) {
      dVar3 = *pdVar32;
      if ((dVar3 != 0.0) || (NAN(dVar3))) {
        bVar18 = -(dVar3 == pdVar32[__size]) & 1;
      }
      else {
        bVar18 = 0;
      }
      (*(char **)(local_128->tunit + 0x10))[__size - 1] = bVar18;
      __size = __size - 1;
    }
LAB_0012433f:
    pdVar32 = pdVar32 + 1;
LAB_00124394:
    *(double **)(local_128->tunit + 0x18) = pdVar32;
    uVar28 = local_f8;
    break;
  case 0x105:
    puVar16 = (undefined8 *)piVar31[uVar22].array;
    if (local_e0 != piVar17) {
      free(*(char **)(piVar21->tunit + 0x10));
      pcVar12 = (char *)malloc((size_t)piVar17);
      *(char **)(local_128->tunit + 0x10) = pcVar12;
      piVar21 = local_128;
      piVar33 = local_118;
      piVar23 = local_f0;
      if (pcVar12 == (char *)0x0) goto LAB_001245f8;
    }
    while (piVar17 != (iteratorCol *)0x0) {
      cVar4 = *(char *)*puVar16;
      if ((cVar4 == '\0') || (cVar4 != *(char *)puVar16[(long)piVar17])) {
        bVar34 = false;
      }
      else {
        iVar8 = strcmp((char *)*puVar16,(char *)puVar16[(long)piVar17]);
        bVar34 = iVar8 == 0;
        piVar21 = local_128;
        piVar33 = local_118;
        piVar23 = local_f0;
      }
      (*(char **)(piVar21->tunit + 0x10) + -1)[(long)piVar17] = bVar34;
      piVar17 = (iteratorCol *)&piVar17[-1].field_0x10f;
    }
    *(undefined8 **)(piVar21->tunit + 0x18) = puVar16 + 1;
    uVar28 = local_f8;
    piVar17 = local_110;
    break;
  case 0x106:
    local_130 = (iteratorCol *)(lVar10 + 1);
    plVar13 = *(long **)(piVar21->tunit + 0x18);
    if (local_e0 != piVar17) {
      if (plVar13 != (long *)0x0) {
        if ((void *)*plVar13 == (void *)0x0) {
          printf("invalid free(bitStrs[0]) at %s:%d\n",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                 ,0x599);
        }
        else {
          free((void *)*plVar13);
        }
      }
      free(plVar13);
      plVar13 = (long *)malloc(local_b8);
      if (plVar13 != (long *)0x0) {
        pvVar14 = malloc((long)local_130 * (long)piVar17);
        *plVar13 = (long)pvVar14;
        piVar33 = local_118;
        piVar23 = local_f0;
        if (pvVar14 != (void *)0x0) goto LAB_00124408;
        free(plVar13);
      }
      *(char **)(local_128->tunit + 0x10) = (char *)0x0;
      *(void **)(local_128->tunit + 0x18) = (void *)0x0;
LAB_001245f8:
      *local_120 = 0x71;
      uVar15 = local_108;
LAB_00124616:
      for (; uVar15 != 0; uVar15 = uVar15 - 0xa0) {
        pDVar6 = lParse->varData;
        if (*(int *)(pDVar6->name + (uVar15 - 0x4c)) == 0x106) {
          if ((void *)**(undefined8 **)(pDVar6->name + (uVar15 - 8)) == (void *)0x0) {
            printf("invalid free(((char**)varData->data)[0]) at %s:%d\n",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                   ,0x60c);
          }
          else {
            free((void *)**(undefined8 **)(pDVar6->name + (uVar15 - 8)));
          }
        }
        if (*(void **)(pDVar6->name + (uVar15 - 0x10)) == (void *)0x0) {
          printf("invalid free(varData->undef) at %s:%d\n",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                 ,0x60d);
        }
        else {
          free(*(void **)(pDVar6->name + (uVar15 - 0x10)));
        }
        pcVar12 = pDVar6->name + (uVar15 - 0x10);
        pcVar12[0] = '\0';
        pcVar12[1] = '\0';
        pcVar12[2] = '\0';
        pcVar12[3] = '\0';
        pcVar12[4] = '\0';
        pcVar12[5] = '\0';
        pcVar12[6] = '\0';
        pcVar12[7] = '\0';
      }
      piVar17 = (iteratorCol *)0x0;
      piVar33 = local_110;
LAB_0012469b:
      lParse->nPrevDataRows = (long)piVar17;
      local_108 = local_108 & 0xffffffff00000000;
      pcVar12 = local_d8;
      while (piVar33 != (iteratorCol *)0x0) {
        local_130 = (iteratorCol *)0x2710;
        if ((long)piVar33 < 10000) {
          local_130 = piVar33;
        }
        Evaluate_Parser(lParse,(long)pcVar12,(long)local_130);
        if (lParse->status != 0) break;
        pNVar7 = lParse->Nodes;
        iVar8 = lParse->resultNode;
        pNVar1 = pNVar7 + iVar8;
        iVar5 = pNVar7[iVar8].type;
        iVar24 = (int)local_108;
        if (pNVar7[iVar8].operation == -1000) {
          iVar24 = 1;
        }
        local_108 = CONCAT44(local_108._4_4_,iVar24);
        if (iVar5 - 0x102U < 3) {
          local_d8 = pcVar12;
          if (iVar24 == 0) {
            lVar26 = *(long *)((long)userPtr + 0x50);
            lVar10 = (pNVar1->value).nelem;
            if (lVar26 == lVar10) {
              local_110 = piVar33;
              ffcvtn(lParse->datatype,(pNVar1->value).data.ptr,(pNVar1->value).undef,
                     lVar26 * (long)local_130,**(int **)((long)userPtr + 0x68),
                     *(void **)((long)userPtr + 0x38),*(void **)((long)userPtr + 0x30),&local_fc,
                     local_120);
            }
            else if (lVar10 == 1) {
              piVar17 = (iteratorCol *)0x0;
              if (0 < (long)local_130) {
                piVar17 = local_130;
              }
              local_110 = piVar33;
              for (piVar23 = (iteratorCol *)0x0; piVar23 != piVar17;
                  piVar23 = (iteratorCol *)((long)&piVar23->fptr + 1)) {
                for (local_138 = 0; (long)local_138 < lVar26; local_138 = local_138 + 1) {
                  ffcvtn(lParse->datatype,
                         (double *)
                         (*(long *)((long)userPtr + 0x58) * (long)piVar23 +
                         (long)(pNVar1->value).data.dblptr),(pNVar1->value).undef + (long)piVar23,1,
                         **(int **)((long)userPtr + 0x68),*(void **)((long)userPtr + 0x38),
                         (void *)((long)*(int *)((long)userPtr + 0x40) *
                                  (lVar26 * (long)piVar23 + local_138) +
                                 *(long *)((long)userPtr + 0x30)),&local_fc,local_120);
                  lVar26 = *(long *)((long)userPtr + 0x50);
                }
              }
            }
            else {
              if (lVar26 < lVar10) {
                lVar10 = lVar26;
              }
              local_128 = (iteratorCol *)(long)(int)lVar10;
              local_118 = (iteratorCol *)0x0;
              if (0 < (long)local_130) {
                local_118 = local_130;
              }
              local_110 = piVar33;
              for (piVar17 = (iteratorCol *)0x0; piVar23 = local_128, local_118 != piVar17;
                  piVar17 = (iteratorCol *)((long)&piVar17->fptr + 1)) {
                lVar10 = (pNVar1->value).nelem * (long)piVar17;
                ffcvtn(lParse->datatype,
                       (double *)
                       (*(long *)((long)userPtr + 0x58) * lVar10 + (long)(pNVar1->value).data.dblptr
                       ),(pNVar1->value).undef + lVar10,(long)local_128,
                       **(int **)((long)userPtr + 0x68),*(void **)((long)userPtr + 0x38),
                       (void *)((long)*(int *)((long)userPtr + 0x40) *
                                *(long *)((long)userPtr + 0x50) * (long)piVar17 +
                               *(long *)((long)userPtr + 0x30)),&local_fc,local_120);
                lVar10 = *(long *)((long)userPtr + 0x50);
                lVar26 = lVar10 - (long)piVar23;
                if (lVar26 != 0 && (long)piVar23 <= lVar10) {
                  memset((void *)((long)(local_128->colname + lVar10 * (long)piVar17 + -0xc) *
                                  (long)*(int *)((long)userPtr + 0x40) +
                                 *(long *)((long)userPtr + 0x30)),0,
                         lVar26 * *(int *)((long)userPtr + 0x40));
                }
              }
            }
            pcVar12 = local_d8;
            piVar33 = local_110;
            if (0 < pNVar1->operation) {
              pvVar14 = (pNVar1->value).data.ptr;
              if (pvVar14 == (void *)0x0) {
                printf("invalid free(result->value.data.ptr) at %s:%d\n",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                       ,0x4df);
              }
              else {
                free(pvVar14);
              }
            }
          }
          else {
            undef = '\0';
            local_128 = (iteratorCol *)0x0;
            if (0 < (long)local_130) {
              local_128 = local_130;
            }
            local_110 = piVar33;
            for (piVar17 = (iteratorCol *)0x0; pcVar12 = local_d8, piVar33 = local_110,
                piVar17 != local_128; piVar17 = (iteratorCol *)((long)&piVar17->fptr + 1)) {
              for (local_138 = 0; (long)local_138 < *(long *)((long)userPtr + 0x50);
                  local_138 = local_138 + 1) {
                ffcvtn(lParse->datatype,&(pNVar1->value).data,&undef,(pNVar1->value).nelem,
                       **(int **)((long)userPtr + 0x68),*(void **)((long)userPtr + 0x38),
                       (void *)((long)*(int *)((long)userPtr + 0x40) *
                                (*(long *)((long)userPtr + 0x50) * (long)piVar17 + local_138) +
                               *(long *)((long)userPtr + 0x30)),&local_fc,local_120);
              }
            }
          }
          iVar8 = *local_120;
          if (iVar8 == -0xb) {
            *local_120 = 0x19c;
            ffpmsg("Numerical overflow while converting expression to necessary datatype");
            goto LAB_00124d39;
          }
        }
        else {
          if (iVar5 == 0x105) {
            if (**(int **)((long)userPtr + 0x68) == 0x10) {
              if (iVar24 == 0) {
                local_110 = piVar33;
                iVar8 = local_fc;
                for (local_138 = 0; (long)local_138 < (long)local_130; local_138 = local_138 + 1) {
                  if ((pNVar1->value).undef[local_138] == '\0') {
                    pdVar32 = (pNVar1->value).data.dblptr + local_138;
                  }
                  else {
                    pdVar32 = *(double **)((long)userPtr + 0x38);
                    iVar8 = 1;
                  }
                  strcpy(*(char **)(*(long *)((long)userPtr + 0x30) + local_138 * 8),
                         (char *)*pdVar32);
                }
              }
              else {
                local_110 = piVar33;
                for (local_138 = 0; iVar8 = local_fc, (long)local_138 < (long)local_130;
                    local_138 = local_138 + 1) {
                  strcpy(*(char **)(*(long *)((long)userPtr + 0x30) + local_138 * 8),
                         &(pNVar1->value).data.log);
                }
              }
            }
            else {
              local_110 = piVar33;
              ffpmsg("Cannot convert string expression to desired type.");
              *local_120 = 0x1b0;
              iVar8 = local_fc;
            }
            local_fc = iVar8;
            piVar33 = local_110;
            if (0 < pNVar1->operation) {
              pcVar11 = *(pNVar1->value).data.strptr;
              if (pcVar11 == (char *)0x0) {
                printf("invalid free(result->value.data.strptr[0]) at %s:%d\n",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                       ,0x535);
              }
              else {
                free(pcVar11);
              }
              pvVar14 = (pNVar1->value).data.ptr;
              if (pvVar14 == (void *)0x0) {
                uVar27 = 0x536;
                goto LAB_00124d32;
              }
LAB_00124d18:
              free(pvVar14);
            }
          }
          else if (iVar5 == 0x106) {
            iVar8 = **(int **)((long)userPtr + 0x68);
            if (iVar8 == 1) {
LAB_00124a72:
              piVar17 = (iteratorCol *)0x0;
              if (0 < (long)local_130) {
                piVar17 = local_130;
              }
              if (iVar24 == 0) {
                for (piVar23 = (iteratorCol *)0x0; local_110 = piVar33, piVar23 != piVar17;
                    piVar23 = (iteratorCol *)((long)&piVar23->fptr + 1)) {
                  for (local_138 = 0; lVar10 = (pNVar1->value).nelem, (long)local_138 < lVar10;
                      local_138 = local_138 + 1) {
                    *(bool *)(lVar10 * (long)piVar23 + *(long *)((long)userPtr + 0x30) + local_138)
                         = *(char *)((long)(pNVar1->value).data.dblptr[(long)piVar23] + local_138)
                           == '1';
                  }
                }
              }
              else {
                for (piVar23 = (iteratorCol *)0x0; local_110 = piVar33, piVar23 != piVar17;
                    piVar23 = (iteratorCol *)((long)&piVar23->fptr + 1)) {
                  for (local_138 = 0; lVar10 = (pNVar1->value).nelem, (long)local_138 < lVar10;
                      local_138 = local_138 + 1) {
                    *(bool *)(lVar10 * (long)piVar23 + *(long *)((long)userPtr + 0x30) + local_138)
                         = *(char *)((long)(pNVar1->value).naxes + local_138 + 0x30) == '1';
                  }
                }
              }
            }
            else if (iVar8 == 0x10) {
              __src = &(pNVar1->value).data;
              if (iVar24 == 0) {
                local_110 = piVar33;
                for (local_138 = 0; (long)local_138 < (long)local_130; local_138 = local_138 + 1) {
                  strcpy(*(char **)(*(long *)((long)userPtr + 0x30) + local_138 * 8),
                         (char *)__src->dblptr[local_138]);
                }
              }
              else {
                local_110 = piVar33;
                for (local_138 = 0; (long)local_138 < (long)local_130; local_138 = local_138 + 1) {
                  strcpy(*(char **)(*(long *)((long)userPtr + 0x30) + local_138 * 8),&__src->log);
                }
              }
            }
            else {
              if (iVar8 == 0xe) goto LAB_00124a72;
              if (iVar8 == 0xb) {
                piVar17 = (iteratorCol *)0x0;
                if (0 < (long)local_130) {
                  piVar17 = local_130;
                }
                lVar10 = -1;
                for (piVar23 = (iteratorCol *)0x0; local_110 = piVar33, piVar23 != piVar17;
                    piVar23 = (iteratorCol *)((long)&piVar23->fptr + 1)) {
                  for (local_138 = 0; (long)local_138 < (pNVar1->value).nelem;
                      local_138 = local_138 + 1) {
                    if ((local_138 & 7) == 0) {
                      *(undefined1 *)(*(long *)((long)userPtr + 0x30) + 1 + lVar10) = 0;
                      lVar10 = lVar10 + 1;
                    }
                    if (iVar24 == 0) {
                      cVar4 = *(char *)((long)(pNVar1->value).data.dblptr[(long)piVar23] + local_138
                                       );
                    }
                    else {
                      cVar4 = *(char *)((long)(pNVar1->value).naxes + local_138 + 0x30);
                    }
                    if (cVar4 == '1') {
                      pbVar2 = (byte *)(*(long *)((long)userPtr + 0x30) + lVar10);
                      *pbVar2 = *pbVar2 | (byte)(0x80 >> ((byte)((long)local_138 % 8) & 0x1f));
                    }
                  }
                }
              }
              else {
                local_110 = piVar33;
                ffpmsg("Cannot convert bit expression to desired type.");
                *local_120 = 0x1b0;
              }
            }
            piVar33 = local_110;
            if (0 < pNVar1->operation) {
              pcVar11 = *(pNVar1->value).data.strptr;
              if (pcVar11 == (char *)0x0) {
                printf("invalid free(result->value.data.strptr[0]) at %s:%d\n",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                       ,0x51b);
              }
              else {
                free(pcVar11);
              }
              pvVar14 = (pNVar1->value).data.ptr;
              if (pvVar14 != (void *)0x0) goto LAB_00124d18;
              uVar27 = 0x51c;
LAB_00124d32:
              printf("invalid free(result->value.data.strptr) at %s:%d\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                     ,uVar27);
            }
          }
LAB_00124d39:
          iVar8 = *local_120;
        }
        pcVar12 = local_130->colname + (long)(pcVar12 + -0xc);
        if (iVar8 != 0) break;
        if (pNVar1->type == 0x105) {
          lVar10 = (long)*(int *)((long)userPtr + 0x40) * (long)local_130;
        }
        else if ((pNVar1->type == 0x106) && (**(int **)((long)userPtr + 0x68) == 0xb)) {
          lVar10 = (long)*(int *)((long)userPtr + 0x40) * (long)local_130 *
                   (((pNVar1->value).nelem + 7) / 8);
        }
        else {
          lVar10 = (long)*(int *)((long)userPtr + 0x40) * (long)local_130 *
                   *(long *)((long)userPtr + 0x50);
        }
        piVar33 = (iteratorCol *)((long)piVar33 - (long)local_130);
        *(long *)((long)userPtr + 0x30) = lVar10 + *(long *)((long)userPtr + 0x30);
      }
      piVar17 = local_e8;
      puVar16 = *(undefined8 **)((long)userPtr + 0x38);
      __dest = (undefined8 *)local_e8[-1].array;
      if ((puVar16 != __dest) && (local_c0 == (long)__dest + (long)*(int *)((long)userPtr + 0x40)))
      {
        if (**(int **)((long)userPtr + 0x68) == 0x10) {
          *(undefined2 *)__dest = *(undefined2 *)*puVar16;
        }
        else {
          memcpy(__dest,puVar16,(long)*(int *)((long)userPtr + 0x40));
        }
      }
      if (local_fc == 0) {
        puVar16 = *(undefined8 **)((long)userPtr + 0x38);
        if (puVar16 == (undefined8 *)piVar17[-1].array) {
          if (**(int **)((long)userPtr + 0x68) == 0x10) {
            *(undefined2 *)*puVar16 = (undefined2)zeros[0];
          }
          else {
            memcpy(puVar16,zeros,(long)*(int *)((long)userPtr + 0x40));
          }
        }
      }
      else {
        *(undefined4 *)(*(long *)((long)userPtr + 0x68) + 0x20) = 1;
      }
      if (lParse->hdutype == 0) {
        iVar8 = *local_120;
      }
      else {
        iVar8 = *local_120;
        if (iVar8 == 0 && pcVar12 + -1 == *(undefined1 **)((long)userPtr + 0x48)) {
          iVar8 = -(uint)(*(long *)(*(long *)((long)userPtr + 0x68) + 0x18) < local_c8);
        }
      }
      return iVar8;
    }
LAB_00124408:
    lVar26 = lVar10 + 7;
    if (lVar10 < 1) {
      lVar10 = 0;
    }
    for (piVar21 = (iteratorCol *)0x0; piVar21 != piVar23;
        piVar21 = (iteratorCol *)((long)&piVar21->fptr + 1)) {
      plVar13[(long)piVar21] = (long)piVar21 * (long)local_130 + *plVar13;
      lVar25 = (long)piVar21 * (lVar26 / 8) + 1;
      for (lVar29 = 0; lVar10 != lVar29; lVar29 = lVar29 + 1) {
        uVar30 = (uint)lVar29 & 7;
        *(byte *)(plVar13[(long)piVar21] + lVar29) =
             (*(byte *)((long)piVar31[uVar22].array + lVar25) >> ((byte)uVar30 ^ 7) & 1) == 0 ^ 0x31
        ;
        lVar25 = lVar25 + (ulong)(uVar30 == 7);
      }
      *(undefined1 *)(plVar13[(long)piVar21] + lVar10) = 0;
    }
    *(long **)(local_128->tunit + 0x10) = plVar13;
    *(long **)(local_128->tunit + 0x18) = plVar13;
    uVar28 = local_f8;
  }
LAB_001244b0:
  uVar15 = local_108;
  uVar22 = local_b0;
  if (*local_120 != 0) goto LAB_00124616;
LAB_001244c6:
  uVar22 = uVar22 + 1;
  uVar15 = local_108 + 0xa0;
  piVar31 = piVar33;
  goto LAB_00124097;
}

Assistant:

int fits_parser_workfn( long    totalrows,     /* I - Total rows to be processed     */
                long    offset,        /* I - Number of rows skipped at start*/
                long    firstrow,      /* I - First row of this iteration    */
                long    nrows,         /* I - Number of rows in this iter    */
                int      nCols,        /* I - Number of columns in use       */
                iteratorCol *colData,  /* IO- Column information/data        */
                void    *userPtr )     /* I - Data handling instructions     */
/*                                                                           */
/* Iterator work function which calls the parser and copies the results      */
/* into either an OutputCol or a data pointer supplied in the userPtr        */
/* structure.                                                                */
/*---------------------------------------------------------------------------*/
{
    int status, constant=0, anyNullThisTime=0;
    long jj, kk, idx, remain, ntodo;
    Node *result;
    iteratorCol * outcol;
    ParseData *lParse = ((parseInfo*)userPtr)->parseData;
    struct ParseStatusVariables *pv = &( ((parseInfo*)userPtr)->parseVariables );
    void *Data0 = 0;

    /* declare variables static to preserve their values between calls */
    long zeros[4] = {0,0,0,0};

    if (DEBUG_PIXFILTER)
       printf("fits_parser_workfn(total=%ld, offset=%ld, first=%ld, rows=%ld, cols=%d)\n",
                totalrows, offset, firstrow, nrows, nCols);
    /*--------------------------------------------------------*/
    /*  Initialization procedures: execute on the first call  */
    /*--------------------------------------------------------*/
    outcol = colData + (nCols - 1);
    if (firstrow == offset+1)
    {
       (pv->userInfo) = (parseInfo*)userPtr;
       (pv->userInfo)->anyNull = 0;

       /* Unfortunately there are two copies of the iterator columns,
	  one inside the parser and one outside maintained by the
	  higher level.  (This could happen if the histogramming
	  routines are binning multiple columns, and so there are
	  multiple parsers being managed at one time.) Upon the first
	  call we make sure they match */
       for (jj = 0; jj<nCols; jj++) {
	 lParse->colData[jj].repeat = colData[jj].repeat;
       }

       if( (pv->userInfo)->maxRows>0 )
          (pv->userInfo)->maxRows = minvalue(totalrows,(pv->userInfo)->maxRows);
       else if( (pv->userInfo)->maxRows<0 )
          (pv->userInfo)->maxRows = totalrows;
       else
          (pv->userInfo)->maxRows = nrows;

       (pv->lastRow) = firstrow + (pv->userInfo)->maxRows - 1;

       /* dataPtr == NULL indicates an iterator-derived column, which
	  means that the first value will be a null value and the remaining
	  values will be the where the outputs are placed */
       if( (pv->userInfo)->dataPtr==NULL ) {

          if( outcol->iotype == InputCol ) {
             ffpmsg("Output column for parser results not found!");
             return( PARSE_NO_OUTPUT );
          }
          /* Data gets set later */
          (pv->Null) = outcol->array;
          (pv->userInfo)->datatype = outcol->datatype;

          /* Check for a TNULL/BLANK keyword for output column/image */

          status = 0;
          (pv->jnull) = 0;
          if (lParse->hdutype == IMAGE_HDU) {
             if (lParse->pixFilter->blank)
                (pv->jnull) = (LONGLONG) lParse->pixFilter->blank;
          }
          else {
	    if (outcol->iotype != TemporaryCol) {
	      ffgknjj( outcol->fptr, "TNULL", outcol->colnum,
		       1, &(pv->jnull), (int*)&jj, &status );
	    }

             if( status==BAD_INTKEY || outcol->iotype == TemporaryCol) {
                /*  Probably ASCII table with text TNULL keyword  */
                switch( (pv->userInfo)->datatype ) {
                   case TSHORT:  (pv->jnull) = (LONGLONG) SHRT_MIN;      break;
                   case TINT:    (pv->jnull) = (LONGLONG) INT_MIN;       break;
                   case TLONG:   (pv->jnull) = (LONGLONG) LONG_MIN;      break;
                }
             }
          }
          (pv->repeat) = outcol->repeat;
/*
          if (DEBUG_PIXFILTER)
            printf("fits_parser_workfn: using null value %ld\n", (pv->jnull));
*/
       } else {

	  /* This clause applies if the user is passing user-allocated 
	     data arrays, which is where the data will be placed.  This 
	     means they should also be passing null values */
          (pv->Data) = (pv->userInfo)->dataPtr;
          (pv->Null) = ((pv->userInfo)->nullPtr ? (pv->userInfo)->nullPtr : zeros);
          (pv->repeat) = lParse->Nodes[lParse->resultNode].value.nelem;

       }

       /* Determine the size of each element of the returned result */

       switch( (pv->userInfo)->datatype ) {
       case TBIT:       /*  Fall through to TBYTE  */
       case TLOGICAL:   /*  Fall through to TBYTE  */
       case TBYTE:     (pv->datasize) = sizeof(char);     break;
       case TSHORT:    (pv->datasize) = sizeof(short);    break;
       case TINT:      (pv->datasize) = sizeof(int);      break;
       case TLONG:     (pv->datasize) = sizeof(long);     break;
       case TLONGLONG: (pv->datasize) = sizeof(LONGLONG); break;
       case TFLOAT:    (pv->datasize) = sizeof(float);    break;
       case TDOUBLE:   (pv->datasize) = sizeof(double);   break;
       case TSTRING:   (pv->datasize) = sizeof(char*);    break;
       }

       /* Determine the size of each element of the calculated result */
       /*   (only matters for numeric/logical data)                   */

       switch( lParse->Nodes[lParse->resultNode].type ) {
       case BOOLEAN:   (pv->resDataSize) = sizeof(char);    break;
       case LONG:      (pv->resDataSize) = sizeof(long);    break;
       case DOUBLE:    (pv->resDataSize) = sizeof(double);  break;
       }
    }

    /*-------------------------------------------*/
    /*  Main loop: process all the rows of data  */
    /*-------------------------------------------*/

    /*  If writing to output column, set first element to appropriate  */
    /*  null value.  If no NULLs encounter, zero out before returning. */
/*
          if (DEBUG_PIXFILTER)
            printf("fits_parser_workfn: using null value %ld\n", (pv->jnull));
*/

    if( (pv->userInfo)->dataPtr == NULL ) {
       /* First, reset Data pointer to start of output array, plus 1
	  because the 0th element is the null value (cute undocumented
	  feature of the iterator!) */
       (pv->Data) = (char*) outcol->array + (pv->datasize);

       /* A TemporaryCol with null value specified explicitly */
       if (outcol->iotype == TemporaryCol && (pv->userInfo)->nullPtr) {

	 pv->Null = (pv->userInfo)->nullPtr;

       } else {

	 /* ... or an OutputCol or TemporaryCol with no explicit null */
	 switch( (pv->userInfo)->datatype ) {
	 case TLOGICAL: *(char  *)(pv->Null) = 'U';             break;
	 case TBYTE:    *(char  *)(pv->Null) = (char )(pv->jnull);    break;
	 case TSHORT:   *(short *)(pv->Null) = (short)(pv->jnull);    break;
	 case TINT:     *(int   *)(pv->Null) = (int  )(pv->jnull);    break;
	 case TLONG:    *(long  *)(pv->Null) = (long )(pv->jnull);    break;
	 case TLONGLONG: *(LONGLONG  *)(pv->Null) = (LONGLONG )(pv->jnull);    break;
	 case TFLOAT:   *(float *)(pv->Null) = FLOATNULLVALUE;  break;
	 case TDOUBLE:  *(double*)(pv->Null) = DOUBLENULLVALUE; break;
	 case TSTRING: (*(char **)(pv->Null))[0] = '\1';
	               (*(char **)(pv->Null))[1] = '\0';        break;
	 }
       }
    }

    /* Alter nrows in case calling routine didn't want to do all rows */

    Data0 = pv->Data; /* Record starting point */
    nrows = minvalue(nrows,(pv->lastRow)-firstrow+1);

    Setup_DataArrays( lParse, nCols, colData, firstrow, nrows );

    /* Parser allocates arrays for each column and calculation it performs. */
    /* Limit number of rows processed during each pass to reduce memory     */
    /* requirements... In most cases, iterator will limit rows to less      */
    /* than 10000 rows per iteration, so this is really only relevant for    */
    /* hk-compressed files which must be decompressed in memory and sent    */
    /* whole to fits_parser_workfn in a single iteration.                           */

    remain = nrows;
    while( remain ) {
       ntodo = minvalue(remain,10000);
       Evaluate_Parser ( lParse, firstrow, ntodo );
       if( lParse->status ) break;

       firstrow += ntodo;
       remain   -= ntodo;

       /*  Copy results into data array  */

       result = lParse->Nodes + lParse->resultNode;
       if( result->operation==CONST_OP ) constant = 1;

       switch( result->type ) {

       case BOOLEAN:
       case LONG:
       case DOUBLE:
          if( constant ) {
             char undef=0;
             for( kk=0; kk<ntodo; kk++ )
                for( jj=0; jj<(pv->repeat); jj++ )
                   ffcvtn( lParse->datatype,
                           &(result->value.data),
                           &undef, result->value.nelem /* 1 */,
                           (pv->userInfo)->datatype, (pv->Null),
                           (char*)(pv->Data) + (kk*(pv->repeat)+jj)*(pv->datasize),
                           &anyNullThisTime, &lParse->status );
          } else {
             if ( (pv->repeat) == result->value.nelem ) {
                ffcvtn( lParse->datatype,
                        result->value.data.ptr,
                        result->value.undef,
                        result->value.nelem*ntodo,
                        (pv->userInfo)->datatype, (pv->Null), (pv->Data),
                        &anyNullThisTime, &lParse->status );
             } else if( result->value.nelem == 1 ) {
                for( kk=0; kk<ntodo; kk++ )
                   for( jj=0; jj<(pv->repeat); jj++ ) {
                      ffcvtn( lParse->datatype,
                              (char*)result->value.data.ptr + kk*(pv->resDataSize),
                              (char*)result->value.undef + kk,
                              1, (pv->userInfo)->datatype, (pv->Null),
                              (char*)(pv->Data) + (kk*(pv->repeat)+jj)*(pv->datasize),
                              &anyNullThisTime, &lParse->status );
                   }
             } else {
                int nCopy;
                nCopy = minvalue( (pv->repeat), result->value.nelem );
                for( kk=0; kk<ntodo; kk++ ) {
                   ffcvtn( lParse->datatype,
                           (char*)result->value.data.ptr
                                  + kk*result->value.nelem*(pv->resDataSize),
                           (char*)result->value.undef
                                  + kk*result->value.nelem,
                           nCopy, (pv->userInfo)->datatype, (pv->Null),
                           (char*)(pv->Data) + (kk*(pv->repeat))*(pv->datasize),
                           &anyNullThisTime, &lParse->status );
                   if( nCopy < (pv->repeat) ) {
                      memset( (char*)(pv->Data) + (kk*(pv->repeat)+nCopy)*(pv->datasize),
                              0, ((pv->repeat)-nCopy)*(pv->datasize));
                   }
                }

             }
             if( result->operation>0 ) {
                FREE( result->value.data.ptr );
             }
          }
          if( lParse->status==OVERFLOW_ERR ) {
             lParse->status = NUM_OVERFLOW;
             ffpmsg("Numerical overflow while converting expression to necessary datatype");
          }
          break;

       case BITSTR:
          switch( (pv->userInfo)->datatype ) {
          case TBYTE:
             idx = -1;
             for( kk=0; kk<ntodo; kk++ ) {
                for( jj=0; jj<result->value.nelem; jj++ ) {
                   if( jj%8 == 0 )
                      ((char*)(pv->Data))[++idx] = 0;
                   if( constant ) {
                      if( result->value.data.str[jj]=='1' )
                         ((char*)(pv->Data))[idx] |= 128>>(jj%8);
                   } else {
                      if( result->value.data.strptr[kk][jj]=='1' )
                         ((char*)(pv->Data))[idx] |= 128>>(jj%8);
                   }
                }
             }
             break;
          case TBIT:
          case TLOGICAL:
             if( constant ) {
                for( kk=0; kk<ntodo; kk++ )
                   for( jj=0; jj<result->value.nelem; jj++ ) {
                      ((char*)(pv->Data))[ jj+kk*result->value.nelem ] =
                         ( result->value.data.str[jj]=='1' );
                   }
             } else {
                for( kk=0; kk<ntodo; kk++ )
                   for( jj=0; jj<result->value.nelem; jj++ ) {
                      ((char*)(pv->Data))[ jj+kk*result->value.nelem ] =
                         ( result->value.data.strptr[kk][jj]=='1' );
                   }
             }
             break; 
          case TSTRING:
             if( constant ) {
                for( jj=0; jj<ntodo; jj++ ) {
                   strcpy( ((char**)(pv->Data))[jj], result->value.data.str );
                }
             } else {
                for( jj=0; jj<ntodo; jj++ ) {
                   strcpy( ((char**)(pv->Data))[jj], result->value.data.strptr[jj] );
                }
             }
             break;
          default:
             ffpmsg("Cannot convert bit expression to desired type.");
             lParse->status = PARSE_BAD_TYPE;
             break;
          }
          if( result->operation>0 ) {
             FREE( result->value.data.strptr[0] );
             FREE( result->value.data.strptr );
          }
          break;

       case STRING:
          if( (pv->userInfo)->datatype==TSTRING ) {
             if( constant ) {
                for( jj=0; jj<ntodo; jj++ )
                   strcpy( ((char**)(pv->Data))[jj], result->value.data.str );
             } else {
                for( jj=0; jj<ntodo; jj++ )
                   if( result->value.undef[jj] ) {
                      anyNullThisTime = 1;
                      strcpy( ((char**)(pv->Data))[jj],
                              *(char **)(pv->Null) );
                   } else {
                      strcpy( ((char**)(pv->Data))[jj],
                              result->value.data.strptr[jj] );
                   }
             }
          } else {
             ffpmsg("Cannot convert string expression to desired type.");
             lParse->status = PARSE_BAD_TYPE;
          }
          if( result->operation>0 ) {
             FREE( result->value.data.strptr[0] );
             FREE( result->value.data.strptr );
          }
          break;
       }

       if( lParse->status ) break;

       /*  Increment Data to point to where the next block should go  */

       if( result->type==BITSTR && (pv->userInfo)->datatype==TBYTE )
          (pv->Data) = (char*)(pv->Data)
                    + (pv->datasize) * ( (result->value.nelem+7)/8 ) * ntodo;
       else if( result->type==STRING )
          (pv->Data) = (char*)(pv->Data) + (pv->datasize) * ntodo;
       else
          (pv->Data) = (char*)(pv->Data) + (pv->datasize) * ntodo * (pv->repeat);
    }

    /* If a TemporaryCol output is used, we want to inform the caller
       what the null value is expected to be */
    if (pv->Null != outcol->array && 
	(Data0) == (char*) outcol->array + (pv->datasize)) {
      if( (pv->userInfo)->datatype == TSTRING )
	memcpy( outcol->array, *(char **)(pv->Null), 2 );
      else 
	memcpy( outcol->array, (pv->Null), (pv->datasize) );
    }

    /* If no NULLs encountered during this pass, set Null value to */
    /* zero to make the writing of the output column data faster   */

    if( anyNullThisTime )
       (pv->userInfo)->anyNull = 1;
    else if( pv->Null == outcol->array ) {
       if( (pv->userInfo)->datatype == TSTRING )
          memcpy( *(char **)(pv->Null), zeros, 2 );
       else 
          memcpy( (pv->Null), zeros, (pv->datasize) );
    }

    /*-------------------------------------------------------*/
    /*  Clean up procedures:  after processing all the rows  */
    /*-------------------------------------------------------*/

    /*  if the calling routine specified that only a limited number    */
    /*  of rows in the table should be processed, return a value of -1 */
    /*  once all the rows have been done, if no other error occurred.  */

    if (lParse->hdutype != IMAGE_HDU && firstrow - 1 == (pv->lastRow)) {
           if (!lParse->status && (pv->userInfo)->maxRows<totalrows) {
                  return (-1);
           }
    }

    return(lParse->status);  /* return successful status */
}